

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_bs.c
# Opt level: O0

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)

{
  byte *pbVar1;
  int iVar2;
  uint local_28;
  uint local_24;
  uint local_20;
  int c;
  jpc_bitstream_t *bitstream_local;
  
  if ((bitstream->openmode_ & 1U) == 0) {
    __assert_fail("bitstream->openmode_ & JPC_BITSTREAM_READ",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                  ,0xf6,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
  }
  if (bitstream->cnt_ < 1) {
    if ((bitstream->flags_ & 4U) == 0) {
      if ((bitstream->flags_ & 2U) == 0) {
        bitstream->buf_ = (bitstream->buf_ & 0xff) << 8;
        if ((bitstream->stream_->flags_ & 7U) == 0) {
          if ((bitstream->stream_->rwlimit_ < 0) ||
             (bitstream->stream_->rwcnt_ < bitstream->stream_->rwlimit_)) {
            iVar2 = bitstream->stream_->cnt_ + -1;
            bitstream->stream_->cnt_ = iVar2;
            if (iVar2 < 0) {
              local_24 = jas_stream_fillbuf(bitstream->stream_,1);
            }
            else {
              bitstream->stream_->rwcnt_ = bitstream->stream_->rwcnt_ + 1;
              pbVar1 = bitstream->stream_->ptr_;
              bitstream->stream_->ptr_ = pbVar1 + 1;
              local_24 = (uint)*pbVar1;
            }
            local_20 = local_24;
          }
          else {
            bitstream->stream_->flags_ = bitstream->stream_->flags_ | 4;
            local_20 = 0xffffffff;
          }
          local_28 = local_20;
        }
        else {
          local_28 = 0xffffffff;
        }
        if (local_28 == 0xffffffff) {
          bitstream->flags_ = bitstream->flags_ | 2;
          bitstream_local._4_4_ = 1;
        }
        else {
          iVar2 = 7;
          if (bitstream->buf_ == 0xff00) {
            iVar2 = 6;
          }
          bitstream->cnt_ = iVar2;
          bitstream->buf_ =
               (long)(int)(local_28 & (1 << ((char)bitstream->cnt_ + 1U & 0x1f)) - 1U) |
               bitstream->buf_;
          bitstream_local._4_4_ = (uint)(bitstream->buf_ >> ((byte)bitstream->cnt_ & 0x3f)) & 1;
        }
      }
      else {
        bitstream->buf_ = 0x7f;
        bitstream->cnt_ = 7;
        bitstream_local._4_4_ = 1;
      }
    }
    else {
      bitstream->cnt_ = 0;
      bitstream_local._4_4_ = 0xffffffff;
    }
    return bitstream_local._4_4_;
  }
  __assert_fail("bitstream->cnt_ <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_bs.c"
                ,0xf7,"int jpc_bitstream_fillbuf(jpc_bitstream_t *)");
}

Assistant:

int jpc_bitstream_fillbuf(jpc_bitstream_t *bitstream)
{
	int c;
	/* Note: The count has already been decremented by the caller. */
	assert(bitstream->openmode_ & JPC_BITSTREAM_READ);
	assert(bitstream->cnt_ <= 0);

	if (bitstream->flags_ & JPC_BITSTREAM_ERR) {
		bitstream->cnt_ = 0;
		return -1;
	}

	if (bitstream->flags_ & JPC_BITSTREAM_EOF) {
		bitstream->buf_ = 0x7f;
		bitstream->cnt_ = 7;
		return 1;
	}

	bitstream->buf_ = (bitstream->buf_ << 8) & 0xffff;
	if ((c = jas_stream_getc((bitstream)->stream_)) == EOF) {
		bitstream->flags_ |= JPC_BITSTREAM_EOF;
		return 1;
	}
	bitstream->cnt_ = (bitstream->buf_ == 0xff00) ? 6 : 7;
	bitstream->buf_ |= c & ((1 << (bitstream->cnt_ + 1)) - 1);
	return (bitstream->buf_ >> bitstream->cnt_) & 1;
}